

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O2

void __thiscall soul::ModuleCloner::populateClonedStruct(ModuleCloner *this,Structure *old)

{
  mapped_type *this_00;
  Structure *pSVar1;
  Member *t;
  long lVar2;
  Structure *local_40 [2];
  RefCountedPtr<soul::Structure> local_30;
  
  local_40[0] = old;
  this_00 = std::__detail::
            _Map_base<const_soul::Structure_*,_std::pair<const_soul::Structure_*const,_soul::RefCountedPtr<soul::Structure>_>,_std::allocator<std::pair<const_soul::Structure_*const,_soul::RefCountedPtr<soul::Structure>_>_>,_std::__detail::_Select1st,_std::equal_to<const_soul::Structure_*>,_std::hash<const_soul::Structure_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<const_soul::Structure_*,_std::pair<const_soul::Structure_*const,_soul::RefCountedPtr<soul::Structure>_>,_std::allocator<std::pair<const_soul::Structure_*const,_soul::RefCountedPtr<soul::Structure>_>_>,_std::__detail::_Select1st,_std::equal_to<const_soul::Structure_*>,_std::hash<const_soul::Structure_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this->structMappings,(key_type *)local_40);
  pSVar1 = RefCountedPtr<soul::Structure>::operator->(this_00);
  t = (pSVar1->members).items;
  for (lVar2 = (pSVar1->members).numActive << 6; lVar2 != 0; lVar2 = lVar2 + -0x40) {
    cloneType((Type *)local_40,this,&t->type);
    Type::operator=(&t->type,(Type *)local_40);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_30);
    t = t + 1;
  }
  return;
}

Assistant:

void populateClonedStruct (const Structure& old)
    {
        for (auto& m : structMappings[std::addressof (old)]->getMembers())
            m.type = cloneType (m.type);
    }